

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanPhysicalDevice.cpp
# Opt level: O0

VkFormatProperties __thiscall
VulkanUtilities::VulkanPhysicalDevice::GetPhysicalDeviceFormatProperties
          (VulkanPhysicalDevice *this,VkFormat imageFormat,VkFormatProperties3 *Properties3)

{
  VkFormatProperties VVar1;
  undefined1 local_78 [8];
  VkFormatProperties2 VkFormatProps2;
  VkFormatProperties3 *Properties3_local;
  VkFormat imageFormat_local;
  VulkanPhysicalDevice *this_local;
  VkFormatProperties formatProperties;
  
  if (Properties3 == (VkFormatProperties3 *)0x0) {
    (*vkGetPhysicalDeviceFormatProperties)
              (this->m_VkDevice,imageFormat,(VkFormatProperties *)((long)&this_local + 4));
  }
  else {
    memset(&VkFormatProps2.formatProperties.bufferFeatures,0,0x28);
    memcpy(Properties3,&VkFormatProps2.formatProperties.bufferFeatures,0x28);
    Properties3->sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_3;
    memset(local_78,0,0x20);
    local_78._0_4_ = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_2;
    VkFormatProps2._0_8_ = Properties3;
    (*vkGetPhysicalDeviceFormatProperties2)
              (this->m_VkDevice,imageFormat,(VkFormatProperties2 *)local_78);
    stack0xffffffffffffffec = VkFormatProps2.pNext;
    formatProperties.linearTilingFeatures = VkFormatProps2.formatProperties.linearTilingFeatures;
  }
  VVar1.bufferFeatures = formatProperties.linearTilingFeatures;
  VVar1._0_8_ = stack0xffffffffffffffec;
  return VVar1;
}

Assistant:

VkFormatProperties VulkanPhysicalDevice::GetPhysicalDeviceFormatProperties(VkFormat imageFormat, VkFormatProperties3* Properties3) const
{
    if (Properties3 != nullptr)
    {
        *Properties3       = {};
        Properties3->sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_3_KHR;

        VkFormatProperties2 VkFormatProps2{};
        VkFormatProps2.sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_2;
        VkFormatProps2.pNext = Properties3;

        vkGetPhysicalDeviceFormatProperties2(m_VkDevice, imageFormat, &VkFormatProps2);

        return VkFormatProps2.formatProperties;
    }
    else
    {
        VkFormatProperties formatProperties;
        vkGetPhysicalDeviceFormatProperties(m_VkDevice, imageFormat, &formatProperties);
        return formatProperties;
    }
}